

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall tonk::gateway::StateMachine::OnSSDPResponse(StateMachine *this,ParsedURL *url)

{
  ostringstream *this_00;
  pointer pGVar1;
  char *__s1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  OutputWorker *this_01;
  uint uVar5;
  bool *pbVar6;
  ulong uVar7;
  undefined1 local_1b8 [32];
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  uint16_t local_158;
  undefined1 local_150 [24];
  unsigned_long uStack_138;
  data_union local_130;
  int local_110;
  __shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> local_108;
  bool local_f8;
  
  pGVar1 = (this->GatewayEndpoints).
           super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (int)((long)(this->GatewayEndpoints).
                      super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3) * -0x3d70a3d7;
  if (0 < (int)uVar5) {
    __s1 = (url->FullURL)._M_dataplus._M_p;
    pbVar6 = &pGVar1->Completed;
    uVar7 = 0;
    do {
      iVar4 = strcasecmp(__s1,(((GatewayEndpoint *)(pbVar6 + -0xc0))->URL).FullURL._M_dataplus._M_p)
      ;
      if (iVar4 == 0) {
        if (*pbVar6 != false) {
          return;
        }
        *(int *)(pbVar6 + -0x18) = 3;
        if ((((shared_ptr<tonk::gateway::HTTPRequester> *)(pbVar6 + -0x10))->
            super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
            (element_type *)0x0) {
          return;
        }
        BeginGatewayXMLRequest(this,(int)uVar7);
        return;
      }
      uVar7 = uVar7 + 1;
      pbVar6 = pbVar6 + 200;
    } while ((uVar5 & 0x7fffffff) != uVar7);
  }
  if (DAT_001e1cd0 < 3) {
    this_00 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = ModuleLogger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,DAT_001e1d00,DAT_001e1d08)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Learned of gateway endpoint via SSDP: ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(url->FullURL)._M_dataplus._M_p,(url->FullURL)._M_string_length);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)&uStack_138);
  }
  local_1b8._8_8_ = 0;
  local_1b8[0x10] = (ostringstream)0x0;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  local_170 = 0;
  local_168._M_local_buf[0] = '\0';
  local_150._0_4_ = ipv4;
  local_150._4_4_ = (in4_addr_type)0x0;
  local_150._8_8_ = 0;
  local_150._16_8_ = 0;
  uStack_138 = 0;
  local_108 = (__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>)
              (ZEXT416(0) << 0x40);
  local_130.v6.sin6_scope_id = 0;
  local_130._8_4_ = 0;
  local_130._12_4_ = 0;
  local_130._16_4_ = 0;
  local_130._20_4_ = 0;
  local_130._0_8_ = 2;
  local_110 = 3;
  local_f8 = false;
  local_1b8._0_8_ = local_1b8 + 0x10;
  local_198._M_p = (pointer)&local_188;
  local_178._M_p = (pointer)&local_168;
  std::__cxx11::string::_M_assign((string *)local_1b8);
  std::__cxx11::string::_M_assign((string *)&local_198);
  std::__cxx11::string::_M_assign((string *)&local_178);
  local_158 = url->Port;
  local_150._0_4_ = (url->IPAddr).type_;
  local_150._4_4_ = (url->IPAddr).ipv4_address_;
  local_150._8_8_ = *(undefined8 *)&(url->IPAddr).ipv6_address_.addr_.__in6_u;
  local_150._16_8_ = *(undefined8 *)((long)&(url->IPAddr).ipv6_address_.addr_.__in6_u + 8);
  uStack_138 = (url->IPAddr).ipv6_address_.scope_id_;
  local_130._0_8_ = *(undefined8 *)&(url->TCPEndpoint).impl_.data_;
  uVar2 = *(undefined8 *)((long)&(url->TCPEndpoint).impl_.data_ + 8);
  uVar3 = *(undefined8 *)((long)&(url->TCPEndpoint).impl_.data_ + 0x14);
  local_130._16_4_ =
       (undefined4)((ulong)*(undefined8 *)((long)&(url->TCPEndpoint).impl_.data_ + 0xc) >> 0x20);
  local_130._20_4_ = (undefined4)uVar3;
  local_130.v6.sin6_scope_id = (uint32_t)((ulong)uVar3 >> 0x20);
  local_130._8_4_ = (undefined4)uVar2;
  local_130._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  std::vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
  push_back(&this->GatewayEndpoints,(value_type *)local_1b8);
  BeginGatewayXMLRequest
            (this,(int)((ulong)((long)(this->GatewayEndpoints).
                                      super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->GatewayEndpoints).
                                     super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3d70a3d7
                  + -1);
  if (local_108._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != &local_168) {
    operator_delete(local_178._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p);
  }
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  return;
}

Assistant:

void StateMachine::OnSSDPResponse(const ParsedURL& url)
{
    const int gatewayCount = (int)GatewayEndpoints.size();

    // Find it if it is already in the list
    for (int gatewayIndex = 0; gatewayIndex < gatewayCount; ++gatewayIndex)
    {
        auto& gateway = GatewayEndpoints[gatewayIndex];

        // If it is already known:
        if (gateway.URL == url)
        {
            if (gateway.Completed) {
                return;
            }

            //ModuleLogger.Debug("Gateway already known - Requesting gateway descriptor again: ", url.FullURL);

            // If a gateway is advertised again, attempt to query its descriptor
            // to handle the case where we rejoined the same LAN
            gateway.RetriesRemaining = protocol::kPortMappingRetries;

            // If a request is not in progress:
            if (nullptr == gateway.Requester) {
                // Start a request now for XML descriptor
                BeginGatewayXMLRequest(gatewayIndex);
            }

            return;
        }
    }

    ModuleLogger.Info("Learned of gateway endpoint via SSDP: ", url.FullURL);

    GatewayEndpoint gateway;
    gateway.URL = url;

    GatewayEndpoints.push_back(gateway);
    const int addedGatewayIndex = (int)GatewayEndpoints.size() - 1;

    BeginGatewayXMLRequest(addedGatewayIndex);
}